

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall
ncnn::NetPrivate::convert_layout(NetPrivate *this,Mat *bottom_blob,Layer *layer,Option *opt)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int _elempack;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  Mat local_78;
  
  if ((bottom_blob->elempack != 0) &&
     (((int)bottom_blob->elemsize << 3) / bottom_blob->elempack == 0x20)) {
    if ((opt->use_bf16_storage == true) && (layer->support_bf16_storage == true)) {
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      cast_float32_to_bfloat16(bottom_blob,&local_78,opt);
      if (&local_78 != bottom_blob) {
        piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (bottom_blob->allocator == (Allocator *)0x0) {
              if (bottom_blob->data != (void *)0x0) {
                free(bottom_blob->data);
              }
            }
            else {
              (*bottom_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        bottom_blob->cstep = 0;
        bottom_blob->data = (void *)0x0;
        bottom_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&bottom_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&bottom_blob->elemsize + 4) = 0;
        bottom_blob->dims = 0;
        bottom_blob->w = 0;
        bottom_blob->h = 0;
        bottom_blob->d = 0;
        bottom_blob->c = 0;
        bottom_blob->data = local_78.data;
        bottom_blob->refcount = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        bottom_blob->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
        bottom_blob->elempack = local_78.elempack;
        bottom_blob->allocator = local_78.allocator;
        bottom_blob->dims = local_78.dims;
        bottom_blob->w = local_78.w;
        bottom_blob->h = local_78.h;
        bottom_blob->d = local_78.d;
        bottom_blob->c = local_78.c;
        bottom_blob->cstep = local_78.cstep;
      }
      piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
    }
    if (bottom_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)bottom_blob->c * bottom_blob->cstep == 0) {
      return -100;
    }
  }
  _elempack = 1;
  if (opt->use_packing_layout != true) goto LAB_001333f5;
  iVar4 = bottom_blob->elempack;
  iVar1 = bottom_blob->dims;
  uVar6 = 0;
  uVar5 = bottom_blob->w * iVar4;
  if (iVar1 != 1) {
    uVar5 = uVar6;
  }
  uVar3 = bottom_blob->h * iVar4;
  if (iVar1 != 2) {
    uVar3 = uVar5;
  }
  uVar5 = bottom_blob->c * iVar4;
  if (1 < iVar1 - 3U) {
    uVar5 = uVar3;
  }
  if (iVar4 != 0) {
    uVar6 = ((int)bottom_blob->elemsize << 3) / iVar4;
  }
  if (layer->support_packing != true) goto LAB_001333f5;
  if (uVar6 == 0x20) {
    if ((uVar5 & 0xf) == 0) {
      iVar4 = cpu_support_x86_avx512();
      _elempack = 0x10;
      if (iVar4 != 0) goto LAB_001333ce;
    }
    if ((uVar5 & 7) == 0) {
      iVar4 = cpu_support_x86_avx();
      _elempack = 8;
      if (iVar4 != 0) goto LAB_001333ce;
    }
    _elempack = (uint)((uVar5 & 3) == 0) * 3 + 1;
  }
LAB_001333ce:
  iVar4 = 4;
  if ((uVar5 & 3) != 0 || uVar6 != 0x10) {
    iVar4 = _elempack;
  }
  _elempack = 8;
  if ((uVar5 & 7) != 0 || uVar6 != 8) {
    _elempack = iVar4;
  }
LAB_001333f5:
  if (bottom_blob->elempack != _elempack) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    convert_packing(bottom_blob,&local_78,_elempack,opt);
    if (&local_78 != bottom_blob) {
      piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (bottom_blob->allocator == (Allocator *)0x0) {
            if (bottom_blob->data != (void *)0x0) {
              free(bottom_blob->data);
            }
          }
          else {
            (*bottom_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      bottom_blob->cstep = 0;
      bottom_blob->data = (void *)0x0;
      bottom_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&bottom_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&bottom_blob->elemsize + 4) = 0;
      bottom_blob->dims = 0;
      bottom_blob->w = 0;
      bottom_blob->h = 0;
      bottom_blob->d = 0;
      bottom_blob->c = 0;
      bottom_blob->data = local_78.data;
      bottom_blob->refcount = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      bottom_blob->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      bottom_blob->elempack = local_78.elempack;
      bottom_blob->allocator = local_78.allocator;
      bottom_blob->dims = local_78.dims;
      bottom_blob->w = local_78.w;
      bottom_blob->h = local_78.h;
      bottom_blob->d = local_78.d;
      bottom_blob->c = local_78.c;
      bottom_blob->cstep = local_78.cstep;
    }
    if (bottom_blob->data == (void *)0x0) {
      bVar7 = true;
    }
    else {
      bVar7 = (long)bottom_blob->c * bottom_blob->cstep == 0;
    }
    piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar7) {
      return -100;
    }
  }
  if ((bottom_blob->elempack != 0) &&
     (((int)bottom_blob->elemsize << 3) / bottom_blob->elempack == 0x10)) {
    if ((opt->use_bf16_storage == true) && (layer->support_bf16_storage == false)) {
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      cast_bfloat16_to_float32(bottom_blob,&local_78,opt);
      if (&local_78 != bottom_blob) {
        piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (bottom_blob->allocator == (Allocator *)0x0) {
              if (bottom_blob->data != (void *)0x0) {
                free(bottom_blob->data);
              }
            }
            else {
              (*bottom_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        bottom_blob->cstep = 0;
        bottom_blob->data = (void *)0x0;
        bottom_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&bottom_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&bottom_blob->elemsize + 4) = 0;
        bottom_blob->dims = 0;
        bottom_blob->w = 0;
        bottom_blob->h = 0;
        bottom_blob->d = 0;
        bottom_blob->c = 0;
        bottom_blob->data = local_78.data;
        bottom_blob->refcount = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        bottom_blob->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
        bottom_blob->elempack = local_78.elempack;
        bottom_blob->allocator = local_78.allocator;
        bottom_blob->dims = local_78.dims;
        bottom_blob->w = local_78.w;
        bottom_blob->h = local_78.h;
        bottom_blob->d = local_78.d;
        bottom_blob->c = local_78.c;
        bottom_blob->cstep = local_78.cstep;
      }
      piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (bottom_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)bottom_blob->c * bottom_blob->cstep == 0) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int NetPrivate::convert_layout(Mat& bottom_blob, const Layer* layer, const Option& opt) const
{
    if (bottom_blob.elembits() == 32)
    {
        // clang-format off
        // *INDENT-OFF*

#if NCNN_ARM82
        if (opt.use_fp16_storage && cpu_support_arm_asimdhp() && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        else
#endif // NCNN_ARM82
#if NCNN_VFPV4
        if (opt.use_fp16_storage && !opt.use_bf16_storage && cpu_support_arm_vfpv4() && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        else
#endif // NCNN_VFPV4
#if NCNN_ZFH
        if (opt.use_fp16_storage && (ncnn::cpu_support_riscv_zvfh() || (!ncnn::cpu_support_riscv_v() && ncnn::cpu_support_riscv_zfh())) && layer->support_fp16_storage)
        {
            Mat bottom_blob_fp16;
            cast_float32_to_float16(bottom_blob, bottom_blob_fp16, opt);
            bottom_blob = bottom_blob_fp16;
        }
        else
#endif // NCNN_ZFH
#if NCNN_BF16
        if (opt.use_bf16_storage && layer->support_bf16_storage)
        {
            Mat bottom_blob_bf16;
            cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
            bottom_blob = bottom_blob_bf16;
        }
        else
#endif // NCNN_BF16
        {
        }

        // *INDENT-ON*
        // clang-format on

        if (bottom_blob.empty())
            return -100;
    }

    int dst_elempack = 1;
    if (opt.use_packing_layout)
    {
        // resolve dst_elempack
        int dims = bottom_blob.dims;
        int elemcount = 0;
        if (dims == 1) elemcount = bottom_blob.elempack * bottom_blob.w;
        if (dims == 2) elemcount = bottom_blob.elempack * bottom_blob.h;
        if (dims == 3 || dims == 4) elemcount = bottom_blob.elempack * bottom_blob.c;

        int elembits = bottom_blob.elembits();

        if (layer->support_packing)
        {
            if (elembits == 32)
            {
#if NCNN_AVX512
                if (elemcount % 16 == 0 && ncnn::cpu_support_x86_avx512())
                    dst_elempack = 16;
                else if (elemcount % 8 == 0 && ncnn::cpu_support_x86_avx())
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_AVX
                if (elemcount % 8 == 0 && ncnn::cpu_support_x86_avx())
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV || NCNN_XTHEADVECTOR
                const int packn = ncnn::cpu_riscv_vlenb() / 4;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 16)
            {
#if NCNN_ARM82
                if (elemcount % 8 == 0 && ncnn::cpu_support_arm_asimdhp() && opt.use_fp16_arithmetic && layer->support_fp16_storage)
                    dst_elempack = 8;
                else if (elemcount % 4 == 0)
                    dst_elempack = 4;
#elif NCNN_RVV || NCNN_XTHEADVECTOR
                const int packn = ncnn::cpu_riscv_vlenb() / 2;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 4 == 0)
                    dst_elempack = 4;
#endif
            }
            if (elembits == 8)
            {
#if NCNN_RVV || NCNN_XTHEADVECTOR
                const int packn = ncnn::cpu_riscv_vlenb() / 1;
                if (elemcount % packn == 0)
                    dst_elempack = packn;
#else
                if (elemcount % 8 == 0)
                    dst_elempack = 8;
#endif
            }
        }
    }

    if (bottom_blob.elempack != dst_elempack)
    {
        Mat bottom_blob_packed;
        convert_packing(bottom_blob, bottom_blob_packed, dst_elempack, opt);
        bottom_blob = bottom_blob_packed;

        if (bottom_blob.empty())
            return -100;
    }

    if (bottom_blob.elembits() == 16)
    {
        // clang-format off
        // *INDENT-OFF*

#if NCNN_ARM82
        if (opt.use_fp16_storage && cpu_support_arm_asimdhp() && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
        else
#endif // NCNN_ARM82
#if NCNN_VFPV4
        if (opt.use_fp16_storage && !opt.use_bf16_storage && cpu_support_arm_vfpv4() && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
        else
#endif // NCNN_VFPV4
#if NCNN_ZFH
        if (opt.use_fp16_storage && (ncnn::cpu_support_riscv_zvfh() || (!ncnn::cpu_support_riscv_v() && ncnn::cpu_support_riscv_zfh())) && !layer->support_fp16_storage)
        {
            Mat bottom_blob_fp32;
            cast_float16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
        else
#endif // NCNN_ZFH
#if NCNN_BF16
        if (opt.use_bf16_storage && !layer->support_bf16_storage)
        {
            Mat bottom_blob_fp32;
            cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
            bottom_blob = bottom_blob_fp32;
        }
        else
#endif // NCNN_BF16
        {
        }

        // *INDENT-ON*
        // clang-format on

        if (bottom_blob.empty())
            return -100;
    }

    return 0;
}